

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O0

int CommandLineTestRunner::RunAllTests(int ac,char **av)

{
  int iVar1;
  TestRegistry *pTVar2;
  MemoryLeakWarningPlugin *this;
  TestRegistry *in_RSI;
  undefined4 in_EDI;
  CommandLineTestRunner runner;
  MemoryLeakWarningPlugin memLeakWarn;
  ConsoleTestOutput backupOutput;
  int result;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  TestOutput *in_stack_ffffffffffffff00;
  MemoryLeakWarningPlugin *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  SimpleString *in_stack_ffffffffffffff18;
  MemoryLeakWarningPlugin *in_stack_ffffffffffffff20;
  CommandLineTestRunner *in_stack_ffffffffffffff30;
  CommandLineTestRunner *in_stack_ffffffffffffff80;
  
  ConsoleTestOutput::ConsoleTestOutput((ConsoleTestOutput *)in_stack_ffffffffffffff00);
  SimpleString::SimpleString
            ((SimpleString *)in_stack_ffffffffffffff00,
             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  MemoryLeakWarningPlugin::MemoryLeakWarningPlugin
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (MemoryLeakDetector *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  SimpleString::~SimpleString((SimpleString *)0x16f543);
  MemoryLeakWarningPlugin::destroyGlobalDetectorAndTurnOffMemoryLeakDetectionInDestructor
            ((MemoryLeakWarningPlugin *)&stack0xffffffffffffff80,true);
  pTVar2 = TestRegistry::getCurrentRegistry();
  (*pTVar2->_vptr_TestRegistry[0xc])(pTVar2,&stack0xffffffffffffff80);
  iVar1 = (int)((ulong)pTVar2 >> 0x20);
  pTVar2 = TestRegistry::getCurrentRegistry();
  CommandLineTestRunner(in_stack_ffffffffffffff30,iVar1,(char **)pTVar2,in_RSI);
  iVar1 = runAllTestsMain(in_stack_ffffffffffffff80);
  ~CommandLineTestRunner((CommandLineTestRunner *)CONCAT44(in_EDI,iVar1));
  if (iVar1 == 0) {
    MemoryLeakWarningPlugin::FinalReport
              (in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
    operator<<(in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  this = (MemoryLeakWarningPlugin *)TestRegistry::getCurrentRegistry();
  SimpleString::SimpleString
            ((SimpleString *)this,
             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  (*(this->super_TestPlugin)._vptr_TestPlugin[0x10])(this,&stack0xffffffffffffff30);
  SimpleString::~SimpleString((SimpleString *)0x16f6bb);
  MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin(this);
  ConsoleTestOutput::~ConsoleTestOutput((ConsoleTestOutput *)0x16f6e0);
  return iVar1;
}

Assistant:

int CommandLineTestRunner::RunAllTests(int ac, const char *const *av)
{
    int result = 0;
    ConsoleTestOutput backupOutput;

    MemoryLeakWarningPlugin memLeakWarn(DEF_PLUGIN_MEM_LEAK);
    memLeakWarn.destroyGlobalDetectorAndTurnOffMemoryLeakDetectionInDestructor(true);
    TestRegistry::getCurrentRegistry()->installPlugin(&memLeakWarn);

    {
        CommandLineTestRunner runner(ac, av, TestRegistry::getCurrentRegistry());
        result = runner.runAllTestsMain();
    }

    if (result == 0) {
        backupOutput << memLeakWarn.FinalReport(0);
    }
    TestRegistry::getCurrentRegistry()->removePluginByName(DEF_PLUGIN_MEM_LEAK);
    return result;
}